

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

bool __thiscall cmGraphVizWriter::ItemExcluded(cmGraphVizWriter *this,cmLinkItem *item)

{
  pointer pcVar1;
  bool bVar2;
  byte bVar3;
  TargetType TVar4;
  int iVar5;
  string *psVar6;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  string itemName;
  string local_58;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  psVar6 = cmLinkItem::AsStr_abi_cxx11_(item);
  pcVar1 = (psVar6->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + psVar6->_M_string_length);
  bVar2 = ItemNameFilteredOut(this,&local_58);
  bVar3 = 1;
  if (bVar2) goto LAB_003a4103;
  if (item->Target == (cmGeneratorTarget *)0x0) {
    bVar3 = this->GenerateForExternals;
  }
  else {
    TVar4 = cmGeneratorTarget::GetType(item->Target);
    if (TVar4 == UTILITY) {
      local_38._M_len = local_58._M_string_length;
      local_38._M_str = local_58._M_dataplus._M_p;
      __str._M_str = "Nightly";
      __str._M_len = 7;
      iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_38,0,7,__str);
      if (iVar5 == 0) goto LAB_003a4103;
      local_38._M_len = local_58._M_string_length;
      local_38._M_str = local_58._M_dataplus._M_p;
      __str_00._M_str = "Continuous";
      __str_00._M_len = 10;
      iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&local_38,0,10,__str_00);
      if (iVar5 == 0) goto LAB_003a4103;
      local_38._M_len = local_58._M_string_length;
      local_38._M_str = local_58._M_dataplus._M_p;
      __str_01._M_str = "Experimental";
      __str_01._M_len = 0xc;
      iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&local_38,0,0xc,__str_01);
      if (iVar5 == 0) goto LAB_003a4103;
    }
    bVar2 = cmGeneratorTarget::IsImported(item->Target);
    if ((bVar2) && (this->GenerateForExternals != true)) goto LAB_003a4103;
    TVar4 = cmGeneratorTarget::GetType(item->Target);
    bVar3 = TargetTypeEnabled(this,TVar4);
  }
  bVar3 = bVar3 ^ 1;
LAB_003a4103:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return (bool)bVar3;
}

Assistant:

bool cmGraphVizWriter::ItemExcluded(cmLinkItem const& item)
{
  auto const itemName = item.AsStr();

  if (this->ItemNameFilteredOut(itemName)) {
    return true;
  }

  if (item.Target == nullptr) {
    return !this->GenerateForExternals;
  }

  if (item.Target->GetType() == cmStateEnums::UTILITY) {
    if (cmHasLiteralPrefix(itemName, "Nightly") ||
        cmHasLiteralPrefix(itemName, "Continuous") ||
        cmHasLiteralPrefix(itemName, "Experimental")) {
      return true;
    }
  }

  if (item.Target->IsImported() && !this->GenerateForExternals) {
    return true;
  }

  return !this->TargetTypeEnabled(item.Target->GetType());
}